

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError TestParameters(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *parameters,
                      double sampleRate,StreamDirection streamDir)

{
  PaSampleFormat PVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  code *pcVar5;
  StreamDirection streamDir_00;
  double dVar6;
  PaStreamParameters *pPVar7;
  int iVar8;
  int iVar9;
  snd_pcm_format_t sVar10;
  PaAlsaDeviceInfo *__n;
  PaSampleFormat availableFormats_00;
  snd_pcm_hw_params_t *paFormat;
  pthread_t pVar11;
  char *pcVar12;
  undefined8 uStack_b0;
  long local_a8;
  long local_a0;
  PaSampleFormat local_98;
  size_t local_90;
  code *local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int __pa_unsure_error_id_1;
  int ret;
  int __pa_unsure_error_id;
  PaAlsaDeviceInfo *devInfo;
  size_t __alsa_alloca_size;
  snd_pcm_hw_params_t *hwParams;
  PaSampleFormat hostFormat;
  PaSampleFormat PStack_38;
  uint numHostChannels;
  PaSampleFormat availableFormats;
  snd_pcm_t *pcm;
  PaError result;
  StreamDirection streamDir_local;
  double sampleRate_local;
  PaStreamParameters *parameters_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  pcm._0_4_ = 0;
  availableFormats = 0;
  uStack_b0 = 0x116fb3;
  pcm._4_4_ = streamDir;
  _result = sampleRate;
  sampleRate_local = (double)parameters;
  parameters_local = (PaStreamParameters *)hostApi;
  __n = (PaAlsaDeviceInfo *)(*(code *)alsa_snd_pcm_hw_params_sizeof)();
  lVar2 = -((ulong)((long)&(__n->baseDeviceInfo).name + 7U) & 0xfffffffffffffff0);
  devInfo = __n;
  __alsa_alloca_size = (size_t)((long)&local_a8 + lVar2);
  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x116fdf;
  memset((void *)((long)&local_a8 + lVar2),0,(size_t)__n);
  pPVar7 = parameters_local;
  if (*(long *)((long)sampleRate_local + 0x18) == 0) {
    iVar9 = *(int *)sampleRate_local;
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x116ff9;
    _ret = GetDeviceInfo((PaUtilHostApiRepresentation *)pPVar7,iVar9);
    local_70 = *(int *)((long)sampleRate_local + 4);
    if (pcm._4_4_ == StreamDirection_In) {
      local_74 = _ret->minInputChannels;
    }
    else {
      local_74 = _ret->minOutputChannels;
    }
    if (local_74 < local_70) {
      local_78 = *(int *)((long)sampleRate_local + 4);
    }
    else {
      if (pcm._4_4_ == StreamDirection_In) {
        local_7c = _ret->minInputChannels;
      }
      else {
        local_7c = _ret->minOutputChannels;
      }
      local_78 = local_7c;
    }
    hostFormat._4_4_ = local_78;
  }
  else {
    hostFormat._4_4_ = *(int *)((long)sampleRate_local + 4);
  }
  pPVar7 = parameters_local;
  dVar6 = sampleRate_local;
  streamDir_00 = pcm._4_4_;
  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x117085;
  paUtilErr_ = AlsaOpen((PaUtilHostApiRepresentation *)pPVar7,(PaStreamParameters *)dVar6,
                        streamDir_00,(snd_pcm_t **)&availableFormats);
  PVar1 = availableFormats;
  sVar4 = __alsa_alloca_size;
  if (paUtilErr_ < 0) {
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1170ac;
    PaUtil_DebugPrint(
                     "Expression \'AlsaOpen( hostApi, parameters, streamDir, &pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1767\n"
                     );
    pcm._0_4_ = paUtilErr_;
  }
  else {
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1170cd;
    (*(code *)alsa_snd_pcm_hw_params_any)(PVar1,sVar4);
    dVar6 = _result;
    PVar1 = availableFormats;
    sVar4 = __alsa_alloca_size;
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1170df;
    iVar8 = SetApproximateSampleRate((snd_pcm_t *)PVar1,(snd_pcm_hw_params_t *)sVar4,dVar6);
    PVar1 = availableFormats;
    iVar9 = hostFormat._4_4_;
    sVar4 = __alsa_alloca_size;
    if (iVar8 < 0) {
      pcm._0_4_ = -0x270d;
    }
    else {
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x117104;
      iVar9 = (*(code *)alsa_snd_pcm_hw_params_set_channels)(PVar1,sVar4,iVar9);
      PVar1 = availableFormats;
      if (iVar9 < 0) {
        pcm._0_4_ = -0x270e;
      }
      else {
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x11711e;
        availableFormats_00 = GetAvailableFormats((snd_pcm_t *)PVar1);
        PVar1 = *(PaSampleFormat *)((long)sampleRate_local + 8);
        PStack_38 = availableFormats_00;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x117133;
        paFormat = (snd_pcm_hw_params_t *)
                   PaUtil_SelectClosestAvailableFormat(availableFormats_00,PVar1);
        paUtilErr_ = (PaError)paFormat;
        hwParams = paFormat;
        if (paUtilErr_ < 0) {
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x11715e;
          PaUtil_DebugPrint(
                           "Expression \'hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1785\n"
                           );
          pcm._0_4_ = paUtilErr_;
        }
        else {
          local_88 = (code *)alsa_snd_pcm_hw_params_set_format;
          local_98 = availableFormats;
          local_90 = __alsa_alloca_size;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x11719a;
          sVar10 = Pa2AlsaFormat((PaSampleFormat)paFormat);
          pcVar5 = local_88;
          sVar4 = local_90;
          PVar1 = local_98;
          *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1171b0;
          __pa_unsure_error_id_1 = (*pcVar5)(PVar1,sVar4,sVar10);
          PVar1 = availableFormats;
          sVar4 = __alsa_alloca_size;
          if (__pa_unsure_error_id_1 < 0) {
            *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1171cb;
            pVar11 = pthread_self();
            *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1171dd;
            iVar8 = pthread_equal(pVar11,paUnixMainThread);
            iVar9 = __pa_unsure_error_id_1;
            if (iVar8 != 0) {
              local_a0 = (long)__pa_unsure_error_id_1;
              *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1171f9;
              pcVar12 = (*alsa_snd_strerror)(iVar9);
              lVar3 = local_a0;
              *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x11720d;
              PaUtil_SetLastHostErrorInfo(paALSA,lVar3,pcVar12);
            }
            *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x11721b;
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1788\n"
                             );
            pcm._0_4_ = -9999;
          }
          else {
            local_68 = 0;
            *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x117241;
            local_68 = (*(code *)alsa_snd_pcm_hw_params)(PVar1,sVar4);
            if (local_68 < 0) {
              if (local_68 == -0x16) {
                pcm._0_4_ = -0x2709;
              }
              else {
                if (local_68 == -0x10) {
                  pcm._0_4_ = -0x2701;
                }
                else {
                  pcm._0_4_ = -9999;
                }
                local_6c = local_68;
                if (local_68 < 0) {
                  if ((PaError)pcm == -9999) {
                    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1172a8;
                    pVar11 = pthread_self();
                    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1172ba;
                    iVar8 = pthread_equal(pVar11,paUnixMainThread);
                    iVar9 = local_6c;
                    if (iVar8 != 0) {
                      local_a8 = (long)local_6c;
                      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1172d6;
                      pcVar12 = (*alsa_snd_strerror)(iVar9);
                      lVar3 = local_a8;
                      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1172ea;
                      PaUtil_SetLastHostErrorInfo(paALSA,lVar3,pcVar12);
                    }
                  }
                  *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x1172f8;
                  PaUtil_DebugPrint(
                                   "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1811\n"
                                   );
                }
              }
            }
          }
        }
      }
    }
  }
  PVar1 = availableFormats;
  if (availableFormats != 0) {
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x117325;
    (*(code *)alsa_snd_pcm_close)(PVar1);
  }
  return (PaError)pcm;
}

Assistant:

static PaError TestParameters( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *parameters,
        double sampleRate, StreamDirection streamDir )
{
    PaError result = paNoError;
    snd_pcm_t *pcm = NULL;
    PaSampleFormat availableFormats;
    /* We are able to adapt to a number of channels less than what the device supports */
    unsigned int numHostChannels;
    PaSampleFormat hostFormat;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    if( !parameters->hostApiSpecificStreamInfo )
    {
        const PaAlsaDeviceInfo *devInfo = GetDeviceInfo( hostApi, parameters->device );
        numHostChannels = PA_MAX( parameters->channelCount, StreamDirection_In == streamDir ?
                devInfo->minInputChannels : devInfo->minOutputChannels );
    }
    else
        numHostChannels = parameters->channelCount;

    PA_ENSURE( AlsaOpen( hostApi, parameters, streamDir, &pcm ) );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( SetApproximateSampleRate( pcm, hwParams, sampleRate ) < 0 )
    {
        result = paInvalidSampleRate;
        goto error;
    }

    if( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, numHostChannels ) < 0 )
    {
        result = paInvalidChannelCount;
        goto error;
    }

    /* See if we can find a best possible match */
    availableFormats = GetAvailableFormats( pcm );
    PA_ENSURE( hostFormat = PaUtil_SelectClosestAvailableFormat( availableFormats, parameters->sampleFormat ) );

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, Pa2AlsaFormat( hostFormat ) ), paUnanticipatedHostError );

    {
        /* It happens that this call fails because the device is busy */
        int ret = 0;
        if( ( ret = alsa_snd_pcm_hw_params( pcm, hwParams ) ) < 0 )
        {
            if( -EINVAL == ret )
            {
                /* Don't know what to return here */
                result = paBadIODeviceCombination;
                goto error;
            }
            else if( -EBUSY == ret )
            {
                result = paDeviceUnavailable;
                PA_DEBUG(( "%s: Device is busy\n", __FUNCTION__ ));
            }
            else
            {
                result = paUnanticipatedHostError;
            }

            ENSURE_( ret, result );
        }
    }

end:
    if( pcm )
    {
        alsa_snd_pcm_close( pcm );
    }
    return result;

error:
    goto end;
}